

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

int formparse(OperationConfig *config,char *input,curl_mime **mimepost,curl_mime **mimecurrent,
             _Bool literal_value)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  int iVar5;
  curl_mime *pcVar6;
  char *__s;
  char *pcVar7;
  curl_mimepart *part;
  char *pcVar8;
  curl_slist *headers;
  curl_mime **local_70;
  OperationConfig *local_68;
  char *type;
  char *data;
  char *local_50;
  char *encoder;
  char *filename;
  char *local_38;
  
  type = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  if (*mimepost == (curl_mime *)0x0) {
    pcVar6 = (curl_mime *)curl_mime_init(config->easy);
    *mimepost = pcVar6;
    if (pcVar6 == (curl_mime *)0x0) {
      warnf(config->global,"curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = pcVar6;
  }
  __s = strdup(input);
  if (__s == (char *)0x0) {
    curl_mfprintf(config->global->errors,"out of memory\n");
    return 2;
  }
  pcVar7 = strchr(__s,0x3d);
  if (pcVar7 == (char *)0x0) {
    warnf(config->global,"Illegally formatted input field!\n");
    free(__s);
    return 0x20;
  }
  pcVar8 = (char *)0x0;
  if (__s < pcVar7) {
    pcVar8 = __s;
  }
  pcVar1 = pcVar7 + 1;
  *pcVar7 = '\0';
  cVar2 = pcVar7[1];
  local_68 = config;
  local_50 = pcVar1;
  if (cVar2 != '(' || literal_value) {
    if (cVar2 == ')' && pcVar8 == (char *)0x0) {
      if (pcVar7[2] == '\0' && !literal_value) {
        if (*mimecurrent == *mimepost) {
          warnf(config->global,"no multipart to terminate!\n");
          free(__s);
          return 9;
        }
        *mimecurrent = (*mimecurrent)->parent->parent;
        goto LAB_0010d3d0;
      }
    }
    else if (cVar2 == '@' && !literal_value) {
      pcVar6 = (curl_mime *)0x0;
      local_70 = mimecurrent;
      local_38 = pcVar8;
      do {
        local_50 = local_50 + 1;
        iVar5 = get_param_part(config,',',&local_50,&data,&type,&filename,&encoder,&headers);
        if (iVar5 < 0) {
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          free(__s);
          return 10;
        }
        if (pcVar6 == (curl_mime *)0x0) {
          if (iVar5 == 0x2c) {
            pcVar6 = (curl_mime *)curl_mime_init(config->easy);
            if (pcVar6 == (curl_mime *)0x0) {
              warnf(config->global,"curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              free(__s);
              return 0xb;
            }
          }
          else {
            pcVar6 = *local_70;
          }
        }
        part = (curl_mimepart *)curl_mime_addpart(pcVar6);
        if (part == (curl_mimepart *)0x0) {
          warnf(config->global,"curl_mime_addpart failed!\n");
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          curl_slist_free_all(headers);
          free(__s);
          return 0xc;
        }
        iVar3 = curl_mime_headers(part,headers,1);
        pcVar7 = data;
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_headers failed!\n");
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          curl_slist_free_all(headers);
          free(__s);
          return 0xd;
        }
        CVar4 = file_or_stdin(part,data);
        if ((CVar4 != CURLE_OK) &&
           (warnf(config->global,"setting file %s  failed!\n",pcVar7), CVar4 != CURLE_READ_ERROR)) {
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          free(__s);
          return 0xe;
        }
        if ((filename != (char *)0x0) && (iVar3 = curl_mime_filename(part), iVar3 != 0)) {
          warnf(config->global,"curl_mime_filename failed!\n");
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          free(__s);
          return 0xf;
        }
        iVar3 = curl_mime_type(part,type);
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_type failed!\n");
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          free(__s);
          return 0x10;
        }
        iVar3 = curl_mime_encoder(part,encoder);
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_encoder failed!\n");
          if (pcVar6 != *local_70) {
            curl_mime_free(pcVar6);
          }
          free(__s);
          return 0x11;
        }
      } while (iVar5 != 0);
      if (pcVar6 != *local_70) {
        part = (curl_mimepart *)curl_mime_addpart();
        if (part == (curl_mimepart *)0x0) {
          warnf(config->global,"curl_mime_addpart failed!\n");
          curl_mime_free(pcVar6);
          free(__s);
          return 0x12;
        }
        iVar5 = curl_mime_subparts(part,pcVar6);
        if (iVar5 != 0) {
          warnf(config->global,"curl_mime_subparts failed!\n");
          curl_mime_free(pcVar6);
          free(__s);
          return 0x13;
        }
      }
      goto LAB_0010dc81;
    }
    local_38 = pcVar8;
    part = (curl_mimepart *)curl_mime_addpart(*mimecurrent);
    config = local_68;
    if (part == (curl_mimepart *)0x0) {
      warnf(local_68->global,"curl_mime_addpart failed!\n");
      free(__s);
      return 0x14;
    }
    if (*pcVar1 == '<' && !literal_value) {
      local_50 = pcVar7 + 2;
      iVar5 = get_param_part(local_68,'\0',&local_50,&data,&type,(char **)0x0,&encoder,&headers);
      if (iVar5 < 0) {
        free(__s);
        return 0x15;
      }
      iVar3 = curl_mime_headers(part,headers,1);
      pcVar7 = data;
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        free(__s);
        return 0x16;
      }
      CVar4 = file_or_stdin(part,data);
      if ((CVar4 != CURLE_OK) &&
         (warnf(config->global,"setting file %s failed!\n",pcVar7), CVar4 != CURLE_READ_ERROR)) {
        free(__s);
        return 0x17;
      }
    }
    else {
      if (literal_value) {
        iVar5 = 0;
        data = pcVar1;
      }
      else {
        iVar5 = get_param_part(local_68,'\0',&local_50,&data,&type,&filename,&encoder,&headers);
        if (iVar5 < 0) {
          free(__s);
          return 0x18;
        }
      }
      iVar3 = curl_mime_headers(part,headers,1);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        free(__s);
        return 0x19;
      }
      iVar3 = curl_mime_data(part,data,0xffffffffffffffff);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_data failed!\n");
        free(__s);
        return 0x1b;
      }
    }
    iVar3 = curl_mime_filename(part,filename);
    if (iVar3 != 0) {
      warnf(config->global,"curl_mime_filename failed!\n");
      free(__s);
      return 0x1c;
    }
    iVar3 = curl_mime_type(part,type);
    if (iVar3 != 0) {
      warnf(config->global,"curl_mime_type failed!\n");
      free(__s);
      return 0x1d;
    }
    iVar3 = curl_mime_encoder(part,encoder);
    if (iVar3 != 0) {
      warnf(config->global,"curl_mime_encoder failed!\n");
      free(__s);
      return 0x1e;
    }
    if (iVar5 != 0) {
      *local_50 = (char)iVar5;
      warnf(config->global,"garbage at end of field specification: %s\n");
    }
  }
  else {
    local_38 = pcVar8;
    iVar5 = get_param_part(config,'\0',&local_50,&data,&type,(char **)0x0,(char **)0x0,&headers);
    if (iVar5 < 0) {
      free(__s);
      return 3;
    }
    pcVar6 = (curl_mime *)curl_mime_init(config->easy);
    if (pcVar6 == (curl_mime *)0x0) {
      warnf(config->global,"curl_mime_init failed!\n");
      curl_slist_free_all(headers);
      free(__s);
      return 4;
    }
    part = (curl_mimepart *)curl_mime_addpart(*mimecurrent);
    if (part == (curl_mimepart *)0x0) {
      warnf(local_68->global,"curl_mime_addpart failed!\n");
      curl_mime_free(pcVar6);
      curl_slist_free_all(headers);
      free(__s);
      return 5;
    }
    iVar5 = curl_mime_subparts(part,pcVar6);
    if (iVar5 != 0) {
      warnf(local_68->global,"curl_mime_subparts failed!\n");
      curl_mime_free(pcVar6);
      curl_slist_free_all(headers);
      free(__s);
      return 6;
    }
    *mimecurrent = pcVar6;
    iVar5 = curl_mime_headers(part,headers,1);
    if (iVar5 != 0) {
      warnf(local_68->global,"curl_mime_headers failed!\n");
      curl_slist_free_all(headers);
      free(__s);
      return 7;
    }
    iVar5 = curl_mime_type(part,type);
    config = local_68;
    if (iVar5 != 0) {
      warnf(local_68->global,"curl_mime_type failed!\n");
      free(__s);
      return 8;
    }
  }
LAB_0010dc81:
  if ((local_38 != (char *)0x0) && (iVar5 = curl_mime_name(part), iVar5 != 0)) {
    warnf(config->global,"curl_mime_name failed!\n");
    free(__s);
    return 0x1f;
  }
LAB_0010d3d0:
  free(__s);
  return 0;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              curl_mime **mimepost,
              curl_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  curl_mimepart *part = NULL;
  CURLcode res;
  int sep = '\0';

  /* Allocate the main mime structure if needed. */
  if(!*mimepost) {
    *mimepost = curl_mime_init(config->easy);
    if(!*mimepost) {
      warnf(config->global, "curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = *mimepost;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents) {
    fprintf(config->global->errors, "out of memory\n");
    return 2;
  }

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      curl_mime *subparts;

      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0) {
        Curl_safefree(contents);
        return 3;
      }
      subparts = curl_mime_init(config->easy);
      if(!subparts) {
        warnf(config->global, "curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 4;
      }
      part = curl_mime_addpart(*mimecurrent);
      if(!part) {
        warnf(config->global, "curl_mime_addpart failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 5;
      }
      if(curl_mime_subparts(part, subparts)) {
        warnf(config->global, "curl_mime_subparts failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 6;
      }
      *mimecurrent = subparts;
      if(curl_mime_headers(part, headers, 1)) {
        warnf(config->global, "curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 7;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 8;
      }
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a mutipart. */
      if(*mimecurrent == *mimepost) {
        warnf(config->global, "no multipart to terminate!\n");
        Curl_safefree(contents);
        return 9;
        }
      *mimecurrent = (*mimecurrent)->parent->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      curl_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 10;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = curl_mime_init(config->easy);
            if(!subparts) {
              warnf(config->global, "curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              Curl_safefree(contents);
              return 11;
            }
          }
        }

        /* Allocate a part for that file. */
        part = curl_mime_addpart(subparts);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 12;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 13;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s  failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            if(subparts != *mimecurrent)
              curl_mime_free(subparts);
            Curl_safefree(contents);
            return 14;
          }
        }
        if(filename && curl_mime_filename(part, filename)) {
          warnf(config->global, "curl_mime_filename failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 15;
        }
        if(curl_mime_type(part, type)) {
          warnf(config->global, "curl_mime_type failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 16;
        }
        if(curl_mime_encoder(part, encoder)) {
          warnf(config->global, "curl_mime_encoder failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 17;
        }

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(subparts != *mimecurrent) {
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 18;
        }
        if(curl_mime_subparts(part, subparts)) {
          warnf(config->global, "curl_mime_subparts failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 19;
        }
      }
    }
    else {
        /* Allocate a mime part. */
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          Curl_safefree(contents);
          return 20;
        }

      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0) {
          Curl_safefree(contents);
          return 21;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 22;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            Curl_safefree(contents);
            return 23;
          }
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0) {
            Curl_safefree(contents);
            return 24;
          }
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 25;
        }

#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(data, strlen(data))) {
          warnf(config->global, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 26;
        }
#endif

        if(curl_mime_data(part, data, CURL_ZERO_TERMINATED)) {
          warnf(config->global, "curl_mime_data failed!\n");
          Curl_safefree(contents);
          return 27;
        }
      }

      if(curl_mime_filename(part, filename)) {
        warnf(config->global, "curl_mime_filename failed!\n");
        Curl_safefree(contents);
        return 28;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 29;
      }
      if(curl_mime_encoder(part, encoder)) {
        warnf(config->global, "curl_mime_encoder failed!\n");
        Curl_safefree(contents);
        return 30;
      }

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s\n", contp);
      }
    }

    /* Set part name. */
    if(name && curl_mime_name(part, name)) {
      warnf(config->global, "curl_mime_name failed!\n");
      Curl_safefree(contents);
      return 31;
    }
  }
  else {
    warnf(config->global, "Illegally formatted input field!\n");
    Curl_safefree(contents);
    return 32;
  }
  Curl_safefree(contents);
  return 0;
}